

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O2

void JsStandardGet(JsObject *self,char *prop,int *flag,JsValue *res)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  JsObject *pJVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  int pos;
  
  puVar1 = (undefined8 *)*self->sb;
  JsLockup((JsLock)puVar1[2]);
  iVar5 = JsListSize((void *)*puVar1);
  pos = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    pos = 0;
  }
  do {
    if (iVar5 == pos) {
      JsUnlock((JsLock)puVar1[2]);
      pJVar3 = self->Prototype;
      if (pJVar3 != (JsObject *)0x0) {
        (*pJVar3->Get)(pJVar3,prop,flag,res);
        return;
      }
      res->type = JS_UNDEFINED;
      return;
    }
    puVar7 = (undefined8 *)JsListGet((void *)*puVar1,pos);
    iVar6 = strcmp((char *)*puVar7,prop);
    pos = pos + 1;
  } while (iVar6 != 0);
  puVar2 = (undefined8 *)puVar7[1];
  (res->u).reference.name = (char *)puVar2[2];
  dVar4 = (double)puVar2[1];
  *(undefined8 *)res = *puVar2;
  (res->u).number = dVar4;
  if (flag != (int *)0x0) {
    *flag = *(int *)(puVar7 + 2);
  }
  JsUnlock((JsLock)puVar1[2]);
  return;
}

Assistant:

void JsStandardGet(struct JsObject *self, char *prop,int* flag, struct JsValue *res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	//锁住
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			*res = *p->value;
			if(flag != NULL)
				*flag = p->attr;
			JsUnlock(sb->lock);
			return;
		}
	}
	//没有发现
	JsUnlock(sb->lock);

	if(!self->Prototype)
		res->type = JS_UNDEFINED;
	else
		(*self->Prototype->Get)(self->Prototype,prop,flag,res);

}